

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O1

void ReadVectorFromFile<xLearn::Node>
               (FILE *file_ptr,vector<xLearn::Node,_std::allocator<xLearn::Node>_> *vec)

{
  pointer pNVar1;
  ostream *poVar2;
  Logger *this;
  size_t len;
  size_type local_68;
  Logger local_5c;
  string local_58;
  string local_38;
  
  this = (Logger *)&local_68;
  if (file_ptr == (FILE *)0x0) {
    local_68 = CONCAT44(local_68._4_4_,2);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ReadVectorFromFile","");
    poVar2 = Logger::Start(ERR,&local_38,0x11c,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x11c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"file_ptr",8);
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    local_68 = 0;
    ReadDataFromDisk(file_ptr,(char *)&local_68,8);
    if (local_68 != 0) {
      pNVar1 = (vec->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (vec->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (vec->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (vec->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pNVar1 != (pointer)0x0) {
        operator_delete(pNVar1);
      }
      std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::resize(vec,local_68);
      ReadDataFromDisk(file_ptr,(char *)(vec->
                                        super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>
                                        )._M_impl.super__Vector_impl_data._M_start,local_68 * 0xc);
      return;
    }
    local_5c.severity_ = ERR;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ReadVectorFromFile","");
    poVar2 = Logger::Start(ERR,&local_38,0x120,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"len",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    this = &local_5c;
  }
  Logger::~Logger(this);
  abort();
}

Assistant:

void ReadVectorFromFile(FILE *file_ptr, std::vector<T> &vec) {
  CHECK_NOTNULL(file_ptr);
  // First, read the length of vector
  size_t len = 0;
  ReadDataFromDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  CHECK_GT(len, 0);
  // Clear the original vector
  std::vector<T>().swap(vec);
  vec.resize(len);
  ReadDataFromDisk(file_ptr, reinterpret_cast<char *>(vec.data()), sizeof(T)*len);
}